

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyramid.c
# Opt level: O1

ImagePyramid * aom_alloc_pyramid(int width,int height,_Bool image_is_16bit)

{
  int iVar1;
  pthread_mutex_t *__mutex;
  void *pvVar2;
  pthread_mutex_t *memblk;
  uint *puVar3;
  ulong uVar4;
  long *plVar5;
  size_t size;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  ulong num;
  
  uVar12 = height;
  if (width < height) {
    uVar12 = width;
  }
  iVar1 = 0x1f;
  if (uVar12 != 0) {
    for (; uVar12 >> iVar1 == 0; iVar1 = iVar1 + -1) {
    }
  }
  iVar11 = 4;
  if (4 < iVar1) {
    iVar11 = iVar1;
  }
  __mutex = (pthread_mutex_t *)aom_calloc(1,0x40);
  if (__mutex == (pthread_mutex_t *)0x0) {
    return (ImagePyramid *)0x0;
  }
  uVar12 = iVar11 - 3;
  num = (ulong)uVar12;
  pvVar2 = aom_calloc(num,0x18);
  *(void **)((long)__mutex + 0x38) = pvVar2;
  memblk = __mutex;
  if (pvVar2 != (void *)0x0) {
    __mutex[1].__data.__lock = uVar12;
    *(undefined4 *)((long)__mutex + 0x2c) = 0;
    memblk = (pthread_mutex_t *)aom_calloc(num,8);
    if (memblk == (pthread_mutex_t *)0x0) {
      aom_free(*(void **)((long)__mutex + 0x38));
      memblk = __mutex;
    }
    else {
      size = 0x10;
      uVar10 = (uint)!image_is_16bit;
      if ((int)(uint)!image_is_16bit < (int)uVar12) {
        uVar4 = (ulong)uVar10;
        puVar3 = (uint *)(*(long *)((long)__mutex + 0x38) + uVar4 * 0x18 + 0x10);
        size = 0x10;
        do {
          uVar6 = width >> ((byte)uVar4 & 0x1f);
          uVar7 = height >> ((byte)uVar4 & 0x1f);
          uVar8 = uVar6 + 0x3f & 0xffffffe0;
          lVar9 = (long)(int)(uVar8 << 4) + size;
          size = (long)(int)((uVar7 + 0x20) * uVar8) + size;
          *(long *)((long)memblk + uVar4 * 8) = lVar9 + 0x10;
          puVar3[-2] = uVar6;
          puVar3[-1] = uVar7;
          *puVar3 = uVar8;
          uVar4 = uVar4 + 1;
          puVar3 = puVar3 + 6;
        } while (num != uVar4);
      }
      uVar4 = (ulong)uVar10;
      pvVar2 = aom_memalign(0x20,size);
      *(void **)((long)__mutex + 0x30) = pvVar2;
      if (pvVar2 != (void *)0x0) {
        if ((int)uVar10 < (int)uVar12) {
          plVar5 = (long *)((ulong)(uVar10 * 0x18) + *(long *)((long)__mutex + 0x38));
          do {
            *plVar5 = *(long *)((long)memblk + uVar4 * 8) + (long)pvVar2;
            uVar4 = uVar4 + 1;
            plVar5 = plVar5 + 3;
          } while (num != uVar4);
        }
        pthread_mutex_init(__mutex,(pthread_mutexattr_t *)0x0);
        goto LAB_002a269f;
      }
      aom_free(*(void **)((long)__mutex + 0x38));
      aom_free(__mutex);
    }
  }
  __mutex = (pthread_mutex_t *)0x0;
LAB_002a269f:
  aom_free(memblk);
  return (ImagePyramid *)__mutex;
}

Assistant:

ImagePyramid *aom_alloc_pyramid(int width, int height, bool image_is_16bit) {
  // Allocate the maximum possible number of layers for this width and height
  const int msb = get_msb(AOMMIN(width, height));
  const int n_levels = AOMMAX(msb - MIN_PYRAMID_SIZE_LOG2, 1);

  ImagePyramid *pyr = aom_calloc(1, sizeof(*pyr));
  if (!pyr) {
    return NULL;
  }

  pyr->layers = aom_calloc(n_levels, sizeof(*pyr->layers));
  if (!pyr->layers) {
    aom_free(pyr);
    return NULL;
  }

  pyr->max_levels = n_levels;
  pyr->filled_levels = 0;

  // Compute sizes and offsets for each pyramid level
  // These are gathered up first, so that we can allocate all pyramid levels
  // in a single buffer
  size_t buffer_size = 0;
  size_t *layer_offsets = aom_calloc(n_levels, sizeof(*layer_offsets));
  if (!layer_offsets) {
    aom_free(pyr->layers);
    aom_free(pyr);
    return NULL;
  }

  // Work out if we need to allocate a few extra bytes for alignment.
  // aom_memalign() will ensure that the start of the allocation is aligned
  // to a multiple of PYRAMID_ALIGNMENT. But we want the first image pixel
  // to be aligned, not the first byte of the allocation.
  //
  // In the loop below, we ensure that the stride of every image is a multiple
  // of PYRAMID_ALIGNMENT. Thus the allocated size of each pyramid level will
  // also be a multiple of PYRAMID_ALIGNMENT. Thus, as long as we can get the
  // first pixel in the first pyramid layer aligned properly, that will
  // automatically mean that the first pixel of every row of every layer is
  // properly aligned too.
  //
  // Thus all we need to consider is the first pixel in the first layer.
  // This is located at offset
  //   extra_bytes + level_stride * PYRAMID_PADDING + PYRAMID_PADDING
  // bytes into the buffer. Since level_stride is a multiple of
  // PYRAMID_ALIGNMENT, we can ignore that. So we need
  //   extra_bytes + PYRAMID_PADDING = multiple of PYRAMID_ALIGNMENT
  //
  // To solve this, we can round PYRAMID_PADDING up to the next multiple
  // of PYRAMID_ALIGNMENT, then subtract the orginal value to calculate
  // how many extra bytes are needed.
  size_t first_px_offset =
      (PYRAMID_PADDING + PYRAMID_ALIGNMENT - 1) & ~(PYRAMID_ALIGNMENT - 1);
  size_t extra_bytes = first_px_offset - PYRAMID_PADDING;
  buffer_size += extra_bytes;

  // If the original image is stored in an 8-bit buffer, then we can point the
  // lowest pyramid level at that buffer rather than allocating a new one.
  int first_allocated_level = image_is_16bit ? 0 : 1;

  for (int level = first_allocated_level; level < n_levels; level++) {
    PyramidLayer *layer = &pyr->layers[level];

    int level_width = width >> level;
    int level_height = height >> level;

    // Allocate padding for each layer
    int padded_width = level_width + 2 * PYRAMID_PADDING;
    int padded_height = level_height + 2 * PYRAMID_PADDING;

    // Align the layer stride to be a multiple of PYRAMID_ALIGNMENT
    // This ensures that, as long as the top-left pixel in this pyramid level is
    // properly aligned, then so will the leftmost pixel in every row of the
    // pyramid level.
    int level_stride =
        (padded_width + PYRAMID_ALIGNMENT - 1) & ~(PYRAMID_ALIGNMENT - 1);

    size_t level_alloc_start = buffer_size;
    size_t level_start =
        level_alloc_start + PYRAMID_PADDING * level_stride + PYRAMID_PADDING;

    buffer_size += level_stride * padded_height;

    layer_offsets[level] = level_start;
    layer->width = level_width;
    layer->height = level_height;
    layer->stride = level_stride;
  }

  pyr->buffer_alloc =
      aom_memalign(PYRAMID_ALIGNMENT, buffer_size * sizeof(*pyr->buffer_alloc));
  if (!pyr->buffer_alloc) {
    aom_free(pyr->layers);
    aom_free(pyr);
    aom_free(layer_offsets);
    return NULL;
  }

  // Fill in pointers for each level
  // If image is 8-bit, then the lowest level is left unconfigured for now,
  // and will be set up properly when the pyramid is filled in
  for (int level = first_allocated_level; level < n_levels; level++) {
    PyramidLayer *layer = &pyr->layers[level];
    layer->buffer = pyr->buffer_alloc + layer_offsets[level];
  }

#if CONFIG_MULTITHREAD
  pthread_mutex_init(&pyr->mutex, NULL);
#endif  // CONFIG_MULTITHREAD

  aom_free(layer_offsets);
  return pyr;
}